

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O0

string * __thiscall ApprovalTests::DiffInfo::getProgramForOs_abi_cxx11_(DiffInfo *this)

{
  bool bVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__lhs;
  string *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  possibleWindowsPaths;
  string result;
  string *result1;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  string *this_00;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string local_c0 [39];
  byte local_99;
  reference local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  string *path_00;
  string local_78;
  string local_50 [32];
  string local_30 [48];
  
  this_00 = in_RDI;
  ::std::__cxx11::string::string(local_30,in_RSI);
  programFileTemplate_abi_cxx11_();
  __lhs = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)::std::__cxx11::string::rfind(local_30,(ulong)local_50);
  ::std::__cxx11::string::~string(local_50);
  if (__lhs == (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x0) {
    getProgramFileLocations_abi_cxx11_();
    path_00 = &local_78;
    local_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    while (bVar1 = __gnu_cxx::operator!=
                             (__lhs,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
                             ), bVar1) {
      local_98 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_88);
      local_99 = 0;
      ::std::__cxx11::string::string(local_c0,local_30);
      programFileTemplate_abi_cxx11_();
      StringUtils::replaceAll
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
      ::std::__cxx11::string::~string(local_c0);
      in_stack_fffffffffffffeff = FileUtils::fileExists(path_00);
      if ((bool)in_stack_fffffffffffffeff) {
        local_99 = 1;
      }
      in_stack_ffffffffffffff1c = (uint)(byte)in_stack_fffffffffffffeff;
      if ((local_99 & 1) == 0) {
        ::std::__cxx11::string::~string((string *)in_RDI);
      }
      if (in_stack_ffffffffffffff1c != 0) goto LAB_0018c549;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_88);
    }
    in_stack_ffffffffffffff1c = 0;
LAB_0018c549:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
    if (in_stack_ffffffffffffff1c != 0) goto LAB_0018c58b;
  }
  ::std::__cxx11::string::string((string *)in_RDI,local_30);
LAB_0018c58b:
  ::std::__cxx11::string::~string(local_30);
  return this_00;
}

Assistant:

std::string DiffInfo::getProgramForOs() const
    {
        std::string result = program;
        if (result.rfind(programFileTemplate(), 0) == 0)
        {
            std::vector<std::string> possibleWindowsPaths = getProgramFileLocations();
            for (const auto& path : possibleWindowsPaths)
            {
                auto result1 =
                    StringUtils::replaceAll(result, programFileTemplate(), path);
                if (FileUtils::fileExists(result1))
                {
                    return result1;
                }
            }
        }
        return result;
    }